

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

vector4 * vector4_normalize(vector4 *self)

{
  short sVar1;
  double f1;
  double mag;
  vector4 *self_local;
  
  f1 = vector4_magnitude(self);
  sVar1 = scalar_equalsf(f1,0.0);
  if (sVar1 == 0) {
    (self->field_0).v[0] = (self->field_0).v[0] / f1;
    (self->field_0).v[1] = (self->field_0).v[1] / f1;
    (self->field_0).v[2] = (self->field_0).v[2] / f1;
    (self->field_0).v[3] = (self->field_0).v[3] / f1;
  }
  return self;
}

Assistant:

HYPAPI struct vector4 *vector4_normalize(struct vector4 *self)
{
	HYP_FLOAT mag;

	mag = vector4_magnitude(self);

	if (scalar_equalsf(mag, 0.0)) {
		/* can't normalize a zero
		 * avoid divide by zero
		 */
		return self;
	}

	self->x = self->x / mag;
	self->y = self->y / mag;
	self->z = self->z / mag;
	self->w = self->w / mag;

	return self;
}